

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCACore.cpp
# Opt level: O1

HRESULT Js::SCACore::ValidateTransferableVars(Var *vars,size_t count)

{
  Var aValue;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  RecyclableObject *this;
  size_t sVar6;
  Type TVar7;
  HRESULT unaff_R15D;
  
  if (count != 0) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    sVar6 = 0;
    do {
      aValue = vars[sVar6];
      if (aValue == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/../Runtime/Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar2) goto LAB_00f1bbaf;
        *puVar5 = 0;
      }
      if (((ulong)aValue & 0x1ffff00000000) != 0x1000000000000 &&
          ((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/../Runtime/Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar2) goto LAB_00f1bbaf;
        *puVar5 = 0;
      }
      TVar7 = TypeIds_FirstNumberType;
      if ((((ulong)aValue & 0xffff000000000000) != 0x1000000000000) &&
         (TVar7 = TypeIds_Number, (ulong)aValue >> 0x32 == 0)) {
        this = UnsafeVarTo<Js::RecyclableObject>(aValue);
        if (this == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/../Runtime/Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar2) goto LAB_00f1bbaf;
          *puVar5 = 0;
        }
        TVar7 = ((this->type).ptr)->typeId;
        if ((0x57 < (int)TVar7) && (BVar4 = RecyclableObject::IsExternal(this), BVar4 == 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/../Runtime/Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar2) goto LAB_00f1bbaf;
          *puVar5 = 0;
        }
      }
      if (TVar7 == TypeIds_ArrayBuffer) {
        bVar3 = JavascriptOperators::IsObjectDetached(vars[sVar6]);
        bVar2 = !bVar3;
        if (bVar3) {
          unaff_R15D = -0x7ffbeffc;
        }
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/SCACore.cpp"
                                    ,0x14,"(false)",
                                    "These should have been filtered out by the host.");
        if (!bVar2) {
LAB_00f1bbaf:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
        unaff_R15D = -0x7ffbeffd;
        bVar2 = false;
      }
      if (!bVar2) {
        return unaff_R15D;
      }
      sVar6 = sVar6 + 1;
    } while (count != sVar6);
  }
  return 0;
}

Assistant:

HRESULT ValidateTransferableVars(Var *vars, size_t count)
        {
            for (size_t i = 0; i < count; i++)
            {
                Js::TypeId typeId = Js::JavascriptOperators::GetTypeId(vars[i]);
                if (typeId != TypeIds_ArrayBuffer)
                {

                    AssertMsg(false, "These should have been filtered out by the host.");
                    return E_SCA_TRANSFERABLE_UNSUPPORTED;
                }

                if (Js::JavascriptOperators::IsObjectDetached(vars[i]))
                {
                    return E_SCA_TRANSFERABLE_NEUTERED;
                }
            }
            return S_OK;
        }